

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml-quants.c
# Opt level: O2

size_t quantize_q4_K(float *src,void *dst,int64_t nrow,int64_t n_per_row,float *quant_weights)

{
  ggml_fp16_t *pgVar1;
  byte *pbVar2;
  byte bVar3;
  byte bVar4;
  ggml_fp16_t gVar5;
  ggml_fp16_t gVar6;
  int l;
  size_t sVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  float *pfVar15;
  uint8_t *puVar16;
  int l_1;
  long lVar17;
  float *pfVar18;
  long lVar19;
  long lVar20;
  int j_1;
  float *pfVar21;
  float *pfVar22;
  float fVar23;
  float fVar24;
  float fVar25;
  uint uStack_2c0;
  uint8_t sc;
  float local_2bc;
  uint8_t Lm [8];
  uint8_t Ls [8];
  float scales [8];
  float mins [8];
  float sw [8];
  uint8_t Laux [32];
  float weights [32];
  uint8_t L [256];
  
  sVar7 = ggml_row_size(GGML_TYPE_Q4_K,n_per_row);
  if (quant_weights == (float *)0x0) {
    quantize_row_q4_K_ref(src,(block_q4_K *)dst,n_per_row * nrow);
  }
  else {
    lVar13 = 0;
    lVar8 = n_per_row / 0x100;
    if (n_per_row / 0x100 < 1) {
      lVar8 = lVar13;
    }
    lVar9 = 0;
    if (0 < nrow) {
      lVar9 = nrow;
    }
    lVar14 = (long)dst + 8;
    for (; lVar13 != lVar9; lVar13 = lVar13 + 1) {
      pfVar15 = quant_weights;
      lVar20 = lVar14;
      pfVar21 = src;
      for (lVar19 = 0; lVar19 != lVar8; lVar19 = lVar19 + 1) {
        fVar24 = 0.0;
        for (lVar10 = 0; lVar10 != 0x100; lVar10 = lVar10 + 1) {
          fVar24 = fVar24 + pfVar21[lVar10] * pfVar21[lVar10];
        }
        fVar24 = (fVar24 + fVar24) * 0.00390625;
        if (fVar24 < 0.0) {
          sqrtf(fVar24);
        }
        pfVar18 = pfVar21;
        pfVar22 = pfVar15;
        for (lVar10 = 0; lVar10 != 8; lVar10 = lVar10 + 1) {
          for (lVar17 = 0; lVar17 != 0x20; lVar17 = lVar17 + 1) {
            fVar23 = pfVar18[lVar17] * pfVar18[lVar17] + fVar24;
            if (fVar23 < 0.0) {
              local_2bc = pfVar22[lVar17];
              fVar23 = sqrtf(fVar23);
              fVar25 = local_2bc;
            }
            else {
              fVar23 = SQRT(fVar23);
              fVar25 = pfVar22[lVar17];
            }
            weights[lVar17] = fVar25 * fVar23;
          }
          fVar23 = 0.0;
          for (lVar17 = 0; lVar17 != 0x20; lVar17 = lVar17 + 1) {
            fVar23 = fVar23 + weights[lVar17];
          }
          sw[lVar10] = fVar23;
          fVar23 = make_qkx3_quants(0x20,0xf,pfVar21 + lVar10 * 0x20,weights,L + lVar10 * 0x20,
                                    mins + lVar10,Laux,fVar23,fVar24,uStack_2c0,SUB41(fVar24,0));
          scales[lVar10] = fVar23;
          pfVar18 = pfVar18 + 0x20;
          pfVar22 = pfVar22 + 0x20;
        }
        local_2bc = make_qp_quants(8,0x3f,scales,Ls,sw);
        fVar24 = make_qp_quants(8,0x3f,mins,Lm,sw);
        for (uVar11 = 0; uVar11 != 8; uVar11 = uVar11 + 1) {
          bVar3 = Ls[uVar11];
          bVar4 = Lm[uVar11];
          if (uVar11 < 4) {
            *(byte *)(lVar20 + -4 + uVar11) = bVar3;
            *(byte *)(lVar20 + uVar11) = bVar4;
          }
          else {
            *(byte *)(lVar20 + uVar11) = bVar4 << 4 | bVar3 & 0xf;
            pbVar2 = (byte *)(lVar20 + -8 + uVar11);
            *pbVar2 = *pbVar2 | (bVar3 & 0x30) << 2;
            pbVar2 = (byte *)(lVar20 + -4 + uVar11);
            *pbVar2 = *pbVar2 | (bVar4 & 0x30) << 2;
          }
        }
        gVar5 = ggml_compute_fp32_to_fp16(local_2bc);
        pgVar1 = (ggml_fp16_t *)((long)dst + lVar19 * 0x90);
        *pgVar1 = gVar5;
        gVar6 = ggml_compute_fp32_to_fp16(fVar24);
        pgVar1[1] = gVar6;
        local_2bc = ggml_table_f32_f16[gVar5];
        puVar16 = L;
        pfVar18 = pfVar21;
        for (lVar10 = 0; lVar10 != 8; lVar10 = lVar10 + 1) {
          get_scale_min_k4((int)lVar10,(uint8_t *)(pgVar1 + 2),&sc,
                           (uint8_t *)((long)register0x00000020 + -0x2be));
          fVar24 = (float)(uStack_2c0 >> 0x18) * local_2bc;
          if ((fVar24 != 0.0) || (NAN(fVar24))) {
            fVar23 = ggml_table_f32_f16[gVar6];
            for (lVar17 = 0; lVar17 != 0x20; lVar17 = lVar17 + 1) {
              uVar12 = (uint)((pfVar18[lVar17] + (float)(uStack_2c0 >> 0x10 & 0xff) * fVar23) /
                              fVar24 + 12582912.0) & 0x7fffff;
              if (0x40000e < uVar12) {
                uVar12 = 0x40000f;
              }
              if (uVar12 < 0x400001) {
                uVar12 = 0;
              }
              puVar16[lVar17] = (uint8_t)uVar12;
            }
          }
          pfVar18 = pfVar18 + 0x20;
          puVar16 = puVar16 + 0x20;
        }
        lVar10 = (long)dst + lVar19 * 0x90 + 0x10;
        puVar16 = L + 0x20;
        for (uVar11 = 0; uVar11 < 0x100; uVar11 = uVar11 + 0x40) {
          for (lVar17 = 0; lVar17 != 0x20; lVar17 = lVar17 + 1) {
            *(uint8_t *)(lVar10 + lVar17) = puVar16[lVar17] << 4 | puVar16[lVar17 + -0x20];
          }
          lVar10 = lVar10 + 0x20;
          puVar16 = puVar16 + 0x40;
        }
        pfVar21 = pfVar21 + 0x100;
        pfVar15 = pfVar15 + 0x100;
        lVar20 = lVar20 + 0x90;
      }
      src = src + n_per_row;
      dst = (void *)((long)dst + sVar7);
      lVar14 = lVar14 + sVar7;
    }
  }
  return sVar7 * nrow;
}

Assistant:

size_t quantize_q4_K(const float * GGML_RESTRICT src, void * GGML_RESTRICT dst, int64_t nrow, int64_t n_per_row, const float * quant_weights) {
    size_t row_size = ggml_row_size(GGML_TYPE_Q4_K, n_per_row);
    if (!quant_weights) {
        quantize_row_q4_K_ref(src, dst, (int64_t)nrow*n_per_row);
    }
    else {
        char * qrow = (char *)dst;
        for (int64_t row = 0; row < nrow; ++row) {
            quantize_row_q4_K_impl(src, (block_q4_K*)qrow, n_per_row, quant_weights);
            src += n_per_row;
            qrow += row_size;
        }
    }
    return nrow * row_size;
}